

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::PlotEx(ImGuiPlotType plot_type,char *label,_func_float_void_ptr_int *values_getter,
                  void *data,int values_count,int values_offset,char *overlay_text,float scale_min,
                  float scale_max,ImVec2 graph_size)

{
  ImVec2 IVar1;
  ImGuiWindow *pIVar2;
  ImU32 IVar3;
  undefined1 auVar4 [16];
  ImGuiContext *pIVar5;
  ImVec2 p_max;
  bool bVar6;
  ImU32 IVar7;
  ImU32 IVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined1 auVar16 [16];
  float fVar17;
  float fVar18;
  float in_XMM2_Dc;
  float in_XMM2_Dd;
  float fVar19;
  float local_158;
  ImVec2 pos1;
  float local_138;
  float fStack_134;
  uint local_128;
  ImVec2 pos0;
  float local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  ImRect local_f8;
  undefined1 local_e8 [16];
  ImGuiContext *local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  ImVec2 local_98;
  char *local_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  ImRect inner_bb;
  ImRect total_bb;
  
  pIVar5 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  if (pIVar2->SkipItems == false) {
    local_98 = CalcTextSize(label,(char *)0x0,true,-1.0);
    local_138 = graph_size.x;
    fStack_134 = graph_size.y;
    if ((local_138 == 0.0) && (!NAN(local_138))) {
      local_138 = CalcItemWidth();
    }
    if ((fStack_134 != 0.0) || (NAN(fStack_134))) {
      fVar14 = (pIVar5->Style).FramePadding.y;
    }
    else {
      fVar14 = (pIVar5->Style).FramePadding.y;
      fStack_134 = fVar14 + fVar14 + local_98.y;
    }
    local_f8.Min = (pIVar2->DC).CursorPos;
    IVar1 = (pIVar2->DC).CursorPos;
    local_f8.Max.x = local_138 + IVar1.x;
    local_f8.Max.y = fStack_134 + IVar1.y;
    local_a8 = (pIVar5->Style).FramePadding.x;
    local_b8 = local_f8.Min.x + local_a8;
    fStack_b4 = local_f8.Min.y + fVar14;
    inner_bb.Min.y = fStack_b4;
    inner_bb.Min.x = local_b8;
    local_a8 = local_f8.Max.x - local_a8;
    fStack_a4 = local_f8.Max.y - fVar14;
    fStack_a0 = (in_XMM2_Dc + 0.0) - 0.0;
    fStack_9c = (in_XMM2_Dd + 0.0) - 0.0;
    fStack_b0 = 0.0;
    fStack_ac = 0.0;
    inner_bb.Max.x = local_a8;
    inner_bb.Max.y = fStack_a4;
    fVar18 = 0.0;
    if (0.0 < local_98.x) {
      fVar18 = (pIVar5->Style).ItemInnerSpacing.x + local_98.x;
    }
    total_bb.Max.x = local_f8.Max.x + fVar18;
    total_bb.Max.y = local_f8.Max.y + 0.0;
    total_bb.Min = local_f8.Min;
    ItemSize(&total_bb,fVar14);
    bVar6 = ItemAdd(&total_bb,0,&local_f8);
    if (bVar6) {
      iVar11 = 0;
      local_e8[0] = ItemHoverable(&inner_bb,0);
      local_80 = label;
      if (((scale_min == 3.4028235e+38) && (!NAN(scale_min))) ||
         ((local_158 = scale_max, local_108 = scale_min, uStack_104 = in_XMM0_Db,
          uStack_100 = in_XMM0_Dc, uStack_fc = in_XMM0_Dd, scale_max == 3.4028235e+38 &&
          (!NAN(scale_max))))) {
        iVar9 = 0;
        if (0 < values_count) {
          iVar9 = values_count;
        }
        fVar14 = 3.4028235e+38;
        fVar18 = -3.4028235e+38;
        for (; iVar9 != iVar11; iVar11 = iVar11 + 1) {
          fVar13 = (*values_getter)(data,iVar11);
          if (fVar13 <= fVar14) {
            fVar14 = fVar13;
          }
          fVar18 = (float)(-(uint)(fVar13 <= fVar18) & (uint)fVar18 |
                          ~-(uint)(fVar13 <= fVar18) & (uint)fVar13);
        }
        local_108 = (float)(~-(uint)(scale_min == 3.4028235e+38) & (uint)scale_min |
                           (uint)fVar14 & -(uint)(scale_min == 3.4028235e+38));
        local_158 = (float)(~-(uint)(scale_max == 3.4028235e+38) & (uint)scale_max |
                           (uint)fVar18 & -(uint)(scale_max == 3.4028235e+38));
        uStack_104 = 0;
        uStack_100 = 0;
        uStack_fc = 0;
      }
      p_max = local_f8.Max;
      IVar1 = local_f8.Min;
      IVar7 = GetColorU32(7,1.0);
      local_d0 = pIVar5;
      RenderFrame(IVar1,p_max,IVar7,true,(pIVar5->Style).FrameRounding);
      if (0 < values_count) {
        iVar11 = (int)local_138;
        if (values_count <= (int)local_138) {
          iVar11 = values_count;
        }
        iVar9 = values_count - (uint)(plot_type == ImGuiPlotType_Lines);
        if (local_e8[0] == '\0') {
          local_128 = 0xffffffff;
        }
        else {
          fVar18 = ((local_d0->IO).MousePos.x - local_b8) / (local_a8 - local_b8);
          fVar14 = 0.9999;
          if (fVar18 <= 0.9999) {
            fVar14 = fVar18;
          }
          local_128 = (uint)((float)iVar9 * (float)(~-(uint)(fVar18 < 0.0) & (uint)fVar14));
          if ((uint)values_count <= local_128) {
            __assert_fail("v_idx >= 0 && v_idx < values_count",
                          "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                          ,0x25b9,
                          "void ImGui::PlotEx(ImGuiPlotType, const char *, float (*)(void *, int), void *, int, int, const char *, float, float, ImVec2)"
                         );
          }
          fVar14 = (*values_getter)(data,(int)(local_128 + values_offset) % values_count);
          (*values_getter)(data,(int)(local_128 + values_offset + 1) % values_count);
          if (plot_type == ImGuiPlotType_Lines) {
            SetTooltip("%d: %8.4g\n%d: %8.4g",(ulong)local_128,(ulong)(local_128 + 1));
          }
          else if (plot_type == ImGuiPlotType_Histogram) {
            SetTooltip("%d: %8.4g",(double)fVar14,(ulong)local_128);
          }
        }
        iVar11 = iVar11 - (uint)(plot_type == ImGuiPlotType_Lines);
        local_e8._0_4_ = (float)iVar11;
        fVar18 = (float)(~-(uint)(local_108 == local_158) & (uint)(1.0 / (local_158 - local_108)));
        fVar14 = (*values_getter)(data,values_offset % values_count);
        fVar13 = (fVar14 - local_108) * fVar18;
        fVar14 = 1.0;
        if (fVar13 <= 1.0) {
          fVar14 = fVar13;
        }
        if (0.0 <= local_158 * local_108) {
          local_c8 = (ulong)~-(uint)(local_108 < 0.0) & 0xffffffff3f800000;
          uStack_c0 = 0;
        }
        else {
          local_c8 = CONCAT44(uStack_104,-local_108 * fVar18) ^ 0x8000000000000000;
          uStack_c0 = CONCAT44(uStack_fc,uStack_100) ^ 0x8000000080000000;
        }
        local_e8 = ZEXT416((uint)(1.0 / (float)local_e8._0_4_));
        IVar7 = GetColorU32((uint)(plot_type != ImGuiPlotType_Lines) * 2 + 0x21,1.0);
        IVar8 = GetColorU32((uint)(plot_type != ImGuiPlotType_Lines) * 2 + 0x22,1.0);
        local_a8 = local_a8 - local_b8;
        fStack_a4 = fStack_a4 - fStack_b4;
        fStack_a0 = fStack_a0 - fStack_b0;
        fStack_9c = fStack_9c - fStack_ac;
        local_78 = fStack_b4;
        fStack_74 = fStack_b4;
        fStack_70 = fStack_b4;
        fStack_6c = fStack_b4;
        local_c8 = CONCAT44(fStack_a4,fStack_a4 * (float)local_c8 + fStack_b4);
        uStack_c0 = CONCAT44(fStack_a4,fStack_a4);
        iVar10 = 0;
        if (0 < iVar11) {
          iVar10 = iVar11;
        }
        fVar17 = 0.0;
        fVar14 = (float)(-(uint)(fVar13 < 0.0) & 0x3f800000 |
                        ~-(uint)(fVar13 < 0.0) & (uint)(1.0 - fVar14));
        local_68 = fStack_a4;
        fStack_64 = fStack_a4;
        fStack_60 = fStack_a4;
        fStack_5c = fStack_a4;
        while (bVar6 = iVar10 != 0, iVar10 = iVar10 + -1, bVar6) {
          uVar12 = (uint)(fVar17 * (float)iVar9 + 0.5);
          if ((uint)values_count <= uVar12) {
            __assert_fail("v1_idx >= 0 && v1_idx < values_count",
                          "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                          ,0x25d3,
                          "void ImGui::PlotEx(ImGuiPlotType, const char *, float (*)(void *, int), void *, int, int, const char *, float, float, ImVec2)"
                         );
          }
          fVar15 = (float)local_e8._0_4_ + fVar17;
          fVar13 = (*values_getter)(data,(int)(values_offset + 1 + uVar12) % values_count);
          fVar19 = (fVar13 - local_108) * fVar18;
          fVar13 = 1.0;
          if (fVar19 <= 1.0) {
            fVar13 = fVar19;
          }
          fVar13 = (float)(-(uint)(fVar19 < 0.0) & 0x3f800000 |
                          ~-(uint)(fVar19 < 0.0) & (uint)(1.0 - fVar13));
          pos0.x = fVar17 * local_a8 + local_b8;
          pos0.y = fVar14 * fStack_a4 + fStack_b4;
          pos1.x = local_a8 * fVar15 + local_b8;
          fVar17 = fVar15;
          fVar14 = fVar13;
          if (plot_type == ImGuiPlotType_Lines) {
            pos1.y = local_68 * fVar13 + local_78;
            IVar3 = IVar7;
            if (local_128 == uVar12) {
              IVar3 = IVar8;
            }
            ImDrawList::AddLine(pIVar2->DrawList,&pos0,&pos1,IVar3,1.0);
          }
          else {
            pos1.y = (float)local_c8;
            if (plot_type == ImGuiPlotType_Histogram) {
              if (pos0.x + 2.0 <= pos1.x) {
                pos1.x = pos1.x + -1.0;
              }
              IVar3 = IVar7;
              if (local_128 == uVar12) {
                IVar3 = IVar8;
              }
              ImDrawList::AddRectFilled(pIVar2->DrawList,&pos0,&pos1,IVar3,0.0,0xf);
            }
          }
        }
      }
      pIVar5 = local_d0;
      if (overlay_text != (char *)0x0) {
        pos0.y = local_f8.Min.y + (local_d0->Style).FramePadding.y;
        pos0.x = local_f8.Min.x;
        pos1.x = 0.5;
        pos1.y = 0.0;
        RenderTextClipped(&pos0,&local_f8.Max,overlay_text,(char *)0x0,(ImVec2 *)0x0,&pos1,
                          (ImRect *)0x0);
      }
      if (0.0 < local_98.x) {
        auVar4._4_4_ = fStack_b4;
        auVar4._0_4_ = local_b8;
        auVar4._8_4_ = fStack_b0;
        auVar4._12_4_ = fStack_ac;
        auVar16._4_12_ = auVar4._4_12_;
        auVar16._0_4_ = local_f8.Max.x + (pIVar5->Style).ItemInnerSpacing.x;
        RenderText(auVar16._0_8_,local_80,(char *)0x0,true);
      }
    }
  }
  return;
}

Assistant:

void ImGui::PlotEx(ImGuiPlotType plot_type, const char* label, float (*values_getter)(void* data, int idx), void* data, int values_count, int values_offset, const char* overlay_text, float scale_min, float scale_max, ImVec2 graph_size)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    if (graph_size.x == 0.0f)
        graph_size.x = CalcItemWidth();
    if (graph_size.y == 0.0f)
        graph_size.y = label_size.y + (style.FramePadding.y * 2);

    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(graph_size.x, graph_size.y));
    const ImRect inner_bb(frame_bb.Min + style.FramePadding, frame_bb.Max - style.FramePadding);
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, 0, &frame_bb))
        return;
    const bool hovered = ItemHoverable(inner_bb, 0);

    // Determine scale from values if not specified
    if (scale_min == FLT_MAX || scale_max == FLT_MAX)
    {
        float v_min = FLT_MAX;
        float v_max = -FLT_MAX;
        for (int i = 0; i < values_count; i++)
        {
            const float v = values_getter(data, i);
            v_min = ImMin(v_min, v);
            v_max = ImMax(v_max, v);
        }
        if (scale_min == FLT_MAX)
            scale_min = v_min;
        if (scale_max == FLT_MAX)
            scale_max = v_max;
    }

    RenderFrame(frame_bb.Min, frame_bb.Max, GetColorU32(ImGuiCol_FrameBg), true, style.FrameRounding);

    if (values_count > 0)
    {
        int res_w = ImMin((int)graph_size.x, values_count) + ((plot_type == ImGuiPlotType_Lines) ? -1 : 0);
        int item_count = values_count + ((plot_type == ImGuiPlotType_Lines) ? -1 : 0);

        // Tooltip on hover
        int v_hovered = -1;
        if (hovered)
        {
            const float t = ImClamp((g.IO.MousePos.x - inner_bb.Min.x) / (inner_bb.Max.x - inner_bb.Min.x), 0.0f, 0.9999f);
            const int v_idx = (int)(t * item_count);
            IM_ASSERT(v_idx >= 0 && v_idx < values_count);

            const float v0 = values_getter(data, (v_idx + values_offset) % values_count);
            const float v1 = values_getter(data, (v_idx + 1 + values_offset) % values_count);
            if (plot_type == ImGuiPlotType_Lines)
                SetTooltip("%d: %8.4g\n%d: %8.4g", v_idx, v0, v_idx+1, v1);
            else if (plot_type == ImGuiPlotType_Histogram)
                SetTooltip("%d: %8.4g", v_idx, v0);
            v_hovered = v_idx;
        }

        const float t_step = 1.0f / (float)res_w;
        const float inv_scale = (scale_min == scale_max) ? 0.0f : (1.0f / (scale_max - scale_min));

        float v0 = values_getter(data, (0 + values_offset) % values_count);
        float t0 = 0.0f;
        ImVec2 tp0 = ImVec2( t0, 1.0f - ImSaturate((v0 - scale_min) * inv_scale) );                       // Point in the normalized space of our target rectangle
        float histogram_zero_line_t = (scale_min * scale_max < 0.0f) ? (-scale_min * inv_scale) : (scale_min < 0.0f ? 0.0f : 1.0f);   // Where does the zero line stands

        const ImU32 col_base = GetColorU32((plot_type == ImGuiPlotType_Lines) ? ImGuiCol_PlotLines : ImGuiCol_PlotHistogram);
        const ImU32 col_hovered = GetColorU32((plot_type == ImGuiPlotType_Lines) ? ImGuiCol_PlotLinesHovered : ImGuiCol_PlotHistogramHovered);

        for (int n = 0; n < res_w; n++)
        {
            const float t1 = t0 + t_step;
            const int v1_idx = (int)(t0 * item_count + 0.5f);
            IM_ASSERT(v1_idx >= 0 && v1_idx < values_count);
            const float v1 = values_getter(data, (v1_idx + values_offset + 1) % values_count);
            const ImVec2 tp1 = ImVec2( t1, 1.0f - ImSaturate((v1 - scale_min) * inv_scale) );

            // NB: Draw calls are merged together by the DrawList system. Still, we should render our batch are lower level to save a bit of CPU.
            ImVec2 pos0 = ImLerp(inner_bb.Min, inner_bb.Max, tp0);
            ImVec2 pos1 = ImLerp(inner_bb.Min, inner_bb.Max, (plot_type == ImGuiPlotType_Lines) ? tp1 : ImVec2(tp1.x, histogram_zero_line_t));
            if (plot_type == ImGuiPlotType_Lines)
            {
                window->DrawList->AddLine(pos0, pos1, v_hovered == v1_idx ? col_hovered : col_base);
            }
            else if (plot_type == ImGuiPlotType_Histogram)
            {
                if (pos1.x >= pos0.x + 2.0f)
                    pos1.x -= 1.0f;
                window->DrawList->AddRectFilled(pos0, pos1, v_hovered == v1_idx ? col_hovered : col_base);
            }

            t0 = t1;
            tp0 = tp1;
        }
    }

    // Text overlay
    if (overlay_text)
        RenderTextClipped(ImVec2(frame_bb.Min.x, frame_bb.Min.y + style.FramePadding.y), frame_bb.Max, overlay_text, NULL, NULL, ImVec2(0.5f,0.0f));

    if (label_size.x > 0.0f)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, inner_bb.Min.y), label);
}